

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall HighsCliqueTable::cleanupFixed(HighsCliqueTable *this,HighsDomain *globaldom)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  
  pdVar4 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = this->nfixings;
  uVar6 = 0;
  do {
    if (((ulong)((long)pdVar4 - (long)pdVar5) >> 3 & 0xffffffff) == uVar6) {
      if (this->nfixings == iVar3) {
        return;
      }
      propagateAndCleanup(this,globaldom);
      return;
    }
    if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar6] == '\0') {
      dVar2 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      pdVar1 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      if ((((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) &&
          (((dVar2 == 1.0 && (!NAN(dVar2))) || ((dVar2 == 0.0 && (!NAN(dVar2))))))) &&
         (vertexInfeasible(this,globaldom,(HighsInt)uVar6,~(int)dVar2 & 1),
         globaldom->infeasible_ != false)) {
        return;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void HighsCliqueTable::cleanupFixed(HighsDomain& globaldom) {
  HighsInt numcol = globaldom.col_upper_.size();
  HighsInt oldnfixings = nfixings;
  for (HighsInt i = 0; i != numcol; ++i) {
    if (colDeleted[i] || globaldom.col_lower_[i] != globaldom.col_upper_[i])
      continue;
    if (globaldom.col_lower_[i] != 1.0 && globaldom.col_lower_[i] != 0.0)
      continue;

    HighsInt fixval = (HighsInt)globaldom.col_lower_[i];
    CliqueVar v(i, 1 - fixval);

    vertexInfeasible(globaldom, v.col, v.val);
    if (globaldom.infeasible()) return;
  }

  if (nfixings != oldnfixings) propagateAndCleanup(globaldom);
}